

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperEQ<fmt::v5::basic_string_view<char>,char[3]>
          (internal *this,char *expected_expression,char *actual_expression,
          basic_string_view<char> *expected,char (*actual) [3])

{
  basic_string_view<char> lhs;
  bool bVar1;
  size_t sVar2;
  char *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar4;
  basic_string_view<char> rhs;
  string local_70;
  string local_50;
  basic_string_view<char> *value;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  lhs = *expected;
  sVar2 = strlen(*actual);
  rhs.size_ = sVar2;
  rhs.data_ = *actual;
  bVar1 = fmt::v5::operator==(lhs,rhs);
  if (bVar1) {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
    PrintToString<fmt::v5::basic_string_view<char>>(&local_50,(testing *)expected,value);
    FormatForComparison<char_const*,fmt::v5::basic_string_view<char>>::Format_abi_cxx11_
              (&local_70,(FormatForComparison<char_const*,fmt::v5::basic_string_view<char>> *)actual
               ,value_00);
    EqFailure(this,expected_expression,actual_expression,&local_50,&local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    sVar3.ptr_ = extraout_RDX;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}